

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::insert
          (QMovableArrayOps<QTextLayout::FormatRange> *this,qsizetype i,qsizetype n,parameter_type t
          )

{
  FormatRange **ppFVar1;
  qsizetype *pqVar2;
  FormatRange *pFVar3;
  long in_FS_OFFSET;
  bool bVar4;
  Inserter local_70;
  undefined8 local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_4_ = t->start;
  local_48._4_4_ = t->length;
  QTextFormat::QTextFormat((QTextFormat *)&puStack_40,&(t->format).super_QTextFormat);
  bVar4 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
          super_QArrayDataPointer<QTextLayout::FormatRange>.size != 0;
  QArrayDataPointer<QTextLayout::FormatRange>::detachAndGrow
            ((QArrayDataPointer<QTextLayout::FormatRange> *)this,(uint)(i == 0 && bVar4),n,
             (FormatRange **)0x0,(QArrayDataPointer<QTextLayout::FormatRange> *)0x0);
  if (i == 0 && bVar4) {
    if (n != 0) {
      do {
        pFVar3 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
        pFVar3[-1].start = (undefined4)local_48;
        pFVar3[-1].length = local_48._4_4_;
        QTextFormat::QTextFormat(&pFVar3[-1].format.super_QTextFormat,(QTextFormat *)&puStack_40);
        ppFVar1 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                   super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
        *ppFVar1 = *ppFVar1 + -1;
        pqVar2 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                  super_QArrayDataPointer<QTextLayout::FormatRange>.size;
        *pqVar2 = *pqVar2 + 1;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    local_70.displaceFrom =
         (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
         super_QArrayDataPointer<QTextLayout::FormatRange>.ptr + i;
    local_70.displaceTo = local_70.displaceFrom + n;
    local_70.bytes =
         ((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
          super_QArrayDataPointer<QTextLayout::FormatRange>.size - i) * 0x18;
    local_70.data = (QArrayDataPointer<QTextLayout::FormatRange> *)this;
    local_70.nInserts = n;
    memmove(local_70.displaceTo,local_70.displaceFrom,local_70.bytes);
    if (n != 0) {
      do {
        (local_70.displaceFrom)->start = (undefined4)local_48;
        (local_70.displaceFrom)->length = local_48._4_4_;
        QTextFormat::QTextFormat
                  (&((local_70.displaceFrom)->format).super_QTextFormat,(QTextFormat *)&puStack_40);
        local_70.displaceFrom = local_70.displaceFrom + 1;
        n = n + -1;
      } while (n != 0);
    }
    Inserter::~Inserter(&local_70);
  }
  QTextFormat::~QTextFormat((QTextFormat *)&puStack_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }